

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

char * blogc_fix_description(char *paragraph)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bc_string_t *str;
  char *suffix;
  char *pcVar4;
  long local_40;
  size_t current;
  size_t start;
  char *tmp;
  _Bool newline;
  _Bool last;
  bc_string_t *rv;
  char *paragraph_local;
  
  if (paragraph == (char *)0x0) {
    return (char *)0x0;
  }
  str = bc_string_new();
  bVar3 = false;
  bVar2 = false;
  current = 0;
  local_40 = 0;
  do {
    cVar1 = paragraph[local_40];
    if (cVar1 == '\0') {
      bVar3 = true;
LAB_00106e46:
      if (!bVar2) {
        pcVar4 = bc_strndup(paragraph + current,local_40 - current);
        suffix = bc_str_strip(pcVar4);
        bc_string_append(str,suffix);
        free(pcVar4);
        if (!bVar3) {
          bc_string_append_c(str,' ');
        }
        current = local_40 + 1;
        bVar2 = true;
      }
    }
    else {
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_00106e46;
      bVar2 = false;
    }
    if (bVar3) {
      pcVar4 = bc_str_strip(str->str);
      pcVar4 = blogc_htmlentities(pcVar4);
      bc_string_free(str,true);
      return pcVar4;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

char*
blogc_fix_description(const char *paragraph)
{
    if (paragraph == NULL)
        return NULL;
    bc_string_t *rv = bc_string_new();
    bool last = false;
    bool newline = false;
    char *tmp = NULL;
    size_t start = 0;
    size_t current = 0;
    while (true) {
        switch (paragraph[current]) {
            case '\0':
                last = true;
            case '\r':
            case '\n':
                if (newline)
                    break;
                tmp = bc_strndup(paragraph + start, current - start);
                bc_string_append(rv, bc_str_strip(tmp));
                free(tmp);
                tmp = NULL;
                if (!last)
                    bc_string_append_c(rv, ' ');
                start = current + 1;
                newline = true;
                break;
            default:
                newline = false;
        }
        if (last)
            break;
        current++;
    }
    tmp = blogc_htmlentities(bc_str_strip(rv->str));
    bc_string_free(rv, true);
    return tmp;
}